

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvnc.cpp
# Opt level: O2

int __thiscall QVncServer::init(QVncServer *this,EVP_PKEY_CTX *ctx)

{
  char cVar1;
  QTcpServer *this_00;
  QDebug *this_01;
  long in_FS_OFFSET;
  QObject aQStack_78 [8];
  QArrayDataPointer<char16_t> local_70;
  undefined4 local_58;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined4 local_44;
  char *local_40;
  QDebug local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QTcpServer *)operator_new(0x10);
  QTcpServer::QTcpServer(this_00,&this->super_QObject);
  this->serverSocket = this_00;
  QHostAddress::QHostAddress((QHostAddress *)&local_58,Any);
  cVar1 = QTcpServer::listen((QHostAddress *)this_00,(ushort)(QHostAddress *)&local_58);
  QHostAddress::~QHostAddress((QHostAddress *)&local_58);
  if (cVar1 == '\0') {
    local_58 = 2;
    local_44 = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_40 = "default";
    QMessageLogger::warning();
    this_01 = QDebug::operator<<(&local_38,"QVncServer could not connect:");
    QTcpServer::errorString();
    QDebug::operator<<(this_01,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    QDebug::~QDebug(&local_38);
  }
  else {
    local_58 = 2;
    local_44 = 0;
    local_54 = 0;
    uStack_4c = 0;
    local_40 = "default";
    QMessageLogger::warning((char *)&local_58,"QVncServer created on port %d",(ulong)this->m_port);
  }
  QObject::connect(aQStack_78,(char *)this->serverSocket,(QObject *)"2newConnection()",(char *)this,
                   0x11612d);
  QMetaObject::Connection::~Connection((Connection *)aQStack_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QVncServer::init()
{
    serverSocket = new QTcpServer(this);
    if (!serverSocket->listen(QHostAddress::Any, m_port))
        qWarning() << "QVncServer could not connect:" << serverSocket->errorString();
    else
        qWarning("QVncServer created on port %d", m_port);

    connect(serverSocket, SIGNAL(newConnection()), this, SLOT(newConnection()));

}